

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFilePath.cpp
# Opt level: O0

void de::FilePath_selfTest(void)

{
  bool bVar1;
  deBool dVar2;
  FilePath *pFVar3;
  char *pcVar4;
  __type local_983;
  bool local_973;
  bool local_963;
  bool local_953;
  bool local_943;
  bool local_933;
  bool local_923;
  bool local_913;
  bool local_903;
  bool local_8e3;
  bool local_8c3;
  bool local_89b;
  bool local_87b;
  bool local_85b;
  bool local_83a;
  bool local_82a;
  bool local_81a;
  bool local_80a;
  bool local_7fa;
  bool local_7ea;
  bool local_7da;
  byte local_7ca;
  byte local_7ba;
  byte local_7ac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  byte local_742;
  byte local_741;
  FilePath local_740;
  string local_720;
  byte local_6fa;
  byte local_6f9;
  FilePath local_6f8;
  string local_6d8;
  byte local_6b2;
  byte local_6b1;
  FilePath local_6b0;
  string local_690;
  byte local_66a;
  byte local_669;
  FilePath local_668;
  string local_648;
  byte local_622;
  byte local_621;
  FilePath local_620;
  string local_600;
  byte local_5da;
  byte local_5d9;
  FilePath local_5d8;
  string local_5b8;
  byte local_592;
  byte local_591;
  FilePath local_590;
  string local_570;
  byte local_54a;
  byte local_549;
  FilePath local_548;
  string local_528;
  byte local_502;
  byte local_501;
  FilePath local_500;
  string local_4e0;
  byte local_4b9;
  FilePath local_4b8;
  byte local_494;
  byte local_493;
  byte local_492;
  byte local_491;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  byte local_409;
  FilePath local_408;
  byte local_3e7;
  byte local_3e6;
  byte local_3e5;
  byte local_3e4;
  byte local_3e3;
  byte local_3e2;
  allocator<char> local_3e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  byte local_339;
  FilePath local_338;
  byte local_313;
  byte local_312;
  byte local_311;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  byte local_2a9;
  FilePath local_2a8;
  byte local_285;
  byte local_284;
  byte local_283;
  byte local_282;
  allocator<char> local_281;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  byte local_219;
  FilePath local_218;
  byte local_1f3;
  byte local_1f2;
  allocator<char> local_1f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  byte local_1c9;
  FilePath local_1c8;
  byte local_1a3;
  byte local_1a2;
  allocator<char> local_1a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  byte local_179;
  FilePath local_178;
  byte local_151;
  FilePath local_150;
  byte local_129;
  FilePath local_128;
  byte local_101;
  FilePath local_100;
  byte local_d9;
  FilePath local_d8;
  byte local_b1;
  FilePath local_b0;
  byte local_89;
  FilePath local_88;
  byte local_61;
  FilePath local_60;
  byte local_29;
  FilePath local_28;
  
  do {
    dVar2 = deGetFalse();
    local_29 = 0;
    local_7ac = 0;
    if (dVar2 == 0) {
      FilePath::FilePath(&local_28,".");
      local_29 = 1;
      bVar1 = FilePath::isAbsolutePath(&local_28);
      local_7ac = bVar1 ^ 0xff;
    }
    if ((local_29 & 1) != 0) {
      FilePath::~FilePath(&local_28);
    }
    if ((local_7ac & 1) == 0) {
      deAssertFail("!FilePath(\".\").isAbsolutePath()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                   ,0xd8);
    }
    dVar2 = deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = deGetFalse();
    local_61 = 0;
    local_7ba = 0;
    if (dVar2 == 0) {
      FilePath::FilePath(&local_60,"..\\foo");
      local_61 = 1;
      bVar1 = FilePath::isAbsolutePath(&local_60);
      local_7ba = bVar1 ^ 0xff;
    }
    if ((local_61 & 1) != 0) {
      FilePath::~FilePath(&local_60);
    }
    if ((local_7ba & 1) == 0) {
      deAssertFail("!FilePath(\"..\\\\foo\").isAbsolutePath()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                   ,0xd9);
    }
    dVar2 = deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = deGetFalse();
    local_89 = 0;
    local_7ca = 0;
    if (dVar2 == 0) {
      FilePath::FilePath(&local_88,"foo");
      local_89 = 1;
      bVar1 = FilePath::isAbsolutePath(&local_88);
      local_7ca = bVar1 ^ 0xff;
    }
    if ((local_89 & 1) != 0) {
      FilePath::~FilePath(&local_88);
    }
    if ((local_7ca & 1) == 0) {
      deAssertFail("!FilePath(\"foo\").isAbsolutePath()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                   ,0xda);
    }
    dVar2 = deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = deGetFalse();
    local_b1 = 0;
    local_7da = false;
    if (dVar2 == 0) {
      FilePath::FilePath(&local_b0,"\\foo/bar");
      local_b1 = 1;
      local_7da = FilePath::isAbsolutePath(&local_b0);
    }
    if ((local_b1 & 1) != 0) {
      FilePath::~FilePath(&local_b0);
    }
    if (local_7da == false) {
      deAssertFail("FilePath(\"\\\\foo/bar\").isAbsolutePath()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                   ,0xdb);
    }
    dVar2 = deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = deGetFalse();
    local_d9 = 0;
    local_7ea = false;
    if (dVar2 == 0) {
      FilePath::FilePath(&local_d8,"/foo");
      local_d9 = 1;
      local_7ea = FilePath::isAbsolutePath(&local_d8);
    }
    if ((local_d9 & 1) != 0) {
      FilePath::~FilePath(&local_d8);
    }
    if (local_7ea == false) {
      deAssertFail("FilePath(\"/foo\").isAbsolutePath()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                   ,0xdc);
    }
    dVar2 = deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = deGetFalse();
    local_101 = 0;
    local_7fa = false;
    if (dVar2 == 0) {
      FilePath::FilePath(&local_100,"\\");
      local_101 = 1;
      local_7fa = FilePath::isAbsolutePath(&local_100);
    }
    if ((local_101 & 1) != 0) {
      FilePath::~FilePath(&local_100);
    }
    if (local_7fa == false) {
      deAssertFail("FilePath(\"\\\\\").isAbsolutePath()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                   ,0xdd);
    }
    dVar2 = deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = deGetFalse();
    local_129 = 0;
    local_80a = false;
    if (dVar2 == 0) {
      FilePath::FilePath(&local_128,"\\\\net\\loc");
      local_129 = 1;
      local_80a = FilePath::isAbsolutePath(&local_128);
    }
    if ((local_129 & 1) != 0) {
      FilePath::~FilePath(&local_128);
    }
    if (local_80a == false) {
      deAssertFail("FilePath(\"\\\\\\\\net\\\\loc\").isAbsolutePath()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                   ,0xde);
    }
    dVar2 = deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = deGetFalse();
    local_151 = 0;
    local_81a = false;
    if (dVar2 == 0) {
      FilePath::FilePath(&local_150,"C:\\file.txt");
      local_151 = 1;
      local_81a = FilePath::isAbsolutePath(&local_150);
    }
    if ((local_151 & 1) != 0) {
      FilePath::~FilePath(&local_150);
    }
    if (local_81a == false) {
      deAssertFail("FilePath(\"C:\\\\file.txt\").isAbsolutePath()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                   ,0xdf);
    }
    dVar2 = deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = deGetFalse();
    local_179 = 0;
    local_82a = false;
    if (dVar2 == 0) {
      FilePath::FilePath(&local_178,"c:/file.txt");
      local_179 = 1;
      local_82a = FilePath::isAbsolutePath(&local_178);
    }
    if ((local_179 & 1) != 0) {
      FilePath::~FilePath(&local_178);
    }
    if (local_82a == false) {
      deAssertFail("FilePath(\"c:/file.txt\").isAbsolutePath()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                   ,0xe0);
    }
    dVar2 = deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = deGetFalse();
    local_1a2 = 0;
    local_1a3 = 0;
    local_1c9 = 0;
    local_83a = false;
    if (dVar2 == 0) {
      std::allocator<char>::allocator();
      local_1a2 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,".",&local_1a1);
      local_1a3 = 1;
      FilePath::FilePath(&local_1c8,".//.");
      local_1c9 = 1;
      pFVar3 = FilePath::normalize(&local_1c8);
      pcVar4 = FilePath::getPath(pFVar3);
      local_83a = std::operator==(&local_1a0,pcVar4);
    }
    if ((local_1c9 & 1) != 0) {
      FilePath::~FilePath(&local_1c8);
    }
    if ((local_1a3 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_1a0);
    }
    if ((local_1a2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_1a1);
    }
    if (local_83a == false) {
      deAssertFail("string(\".\") == FilePath(\".//.\").normalize().getPath()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                   ,0xe2);
    }
    dVar2 = deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = deGetFalse();
    local_1f2 = 0;
    local_1f3 = 0;
    local_219 = 0;
    local_85b = false;
    if (dVar2 == 0) {
      std::allocator<char>::allocator();
      local_1f2 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,".",&local_1f1);
      local_1f3 = 1;
      FilePath::FilePath(&local_218,".");
      local_219 = 1;
      pFVar3 = FilePath::normalize(&local_218);
      pcVar4 = FilePath::getPath(pFVar3);
      local_85b = std::operator==(&local_1f0,pcVar4);
    }
    if ((local_219 & 1) != 0) {
      FilePath::~FilePath(&local_218);
    }
    if ((local_1f3 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_1f0);
    }
    if ((local_1f2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_1f1);
    }
    if (local_85b == false) {
      deAssertFail("string(\".\") == FilePath(\".\").normalize().getPath()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                   ,0xe3);
    }
    dVar2 = deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = deGetFalse();
    local_282 = 0;
    local_283 = 0;
    local_284 = 0;
    local_285 = 0;
    local_2a9 = 0;
    local_87b = false;
    if (dVar2 == 0) {
      std::allocator<char>::allocator();
      local_282 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"..",&local_281);
      local_283 = 1;
      std::operator+(&local_260,&local_280,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     FilePath::separator_abi_cxx11_);
      local_284 = 1;
      std::operator+(&local_240,&local_260,"test");
      local_285 = 1;
      FilePath::FilePath(&local_2a8,"foo/../bar/../../test");
      local_2a9 = 1;
      pFVar3 = FilePath::normalize(&local_2a8);
      pcVar4 = FilePath::getPath(pFVar3);
      local_87b = std::operator==(&local_240,pcVar4);
    }
    if ((local_2a9 & 1) != 0) {
      FilePath::~FilePath(&local_2a8);
    }
    if ((local_285 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_240);
    }
    if ((local_284 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_260);
    }
    if ((local_283 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_280);
    }
    if ((local_282 & 1) != 0) {
      std::allocator<char>::~allocator(&local_281);
    }
    if (local_87b == false) {
      deAssertFail("(string(\"..\") + FilePath::separator + \"test\") == FilePath(\"foo/../bar/../../test\").normalize().getPath()"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                   ,0xe4);
    }
    dVar2 = deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = deGetFalse();
    local_311 = 0;
    local_312 = 0;
    local_313 = 0;
    local_339 = 0;
    local_89b = false;
    if (dVar2 == 0) {
      std::operator+(&local_310,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     FilePath::separator_abi_cxx11_,"foo");
      local_311 = 1;
      std::operator+(&local_2f0,&local_310,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     FilePath::separator_abi_cxx11_);
      local_312 = 1;
      std::operator+(&local_2d0,&local_2f0,"foo.txt");
      local_313 = 1;
      FilePath::FilePath(&local_338,"/foo\\bar/..\\dir\\..\\foo.txt");
      local_339 = 1;
      pFVar3 = FilePath::normalize(&local_338);
      pcVar4 = FilePath::getPath(pFVar3);
      local_89b = std::operator==(&local_2d0,pcVar4);
    }
    if ((local_339 & 1) != 0) {
      FilePath::~FilePath(&local_338);
    }
    if ((local_313 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_2d0);
    }
    if ((local_312 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_2f0);
    }
    if ((local_311 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_310);
    }
    if (local_89b == false) {
      deAssertFail("(FilePath::separator + \"foo\" + FilePath::separator + \"foo.txt\") == FilePath(\"/foo\\\\bar/..\\\\dir\\\\..\\\\foo.txt\").normalize().getPath()"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                   ,0xe5);
    }
    dVar2 = deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = deGetFalse();
    local_3e2 = 0;
    local_3e3 = 0;
    local_3e4 = 0;
    local_3e5 = 0;
    local_3e6 = 0;
    local_3e7 = 0;
    local_409 = 0;
    local_8c3 = false;
    if (dVar2 == 0) {
      std::allocator<char>::allocator();
      local_3e2 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,"c:",&local_3e1);
      local_3e3 = 1;
      std::operator+(&local_3c0,&local_3e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     FilePath::separator_abi_cxx11_);
      local_3e4 = 1;
      std::operator+(&local_3a0,&local_3c0,"foo");
      local_3e5 = 1;
      std::operator+(&local_380,&local_3a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     FilePath::separator_abi_cxx11_);
      local_3e6 = 1;
      std::operator+(&local_360,&local_380,"foo.txt");
      local_3e7 = 1;
      FilePath::FilePath(&local_408,"c:/foo\\bar/..\\dir\\..\\foo.txt");
      local_409 = 1;
      pFVar3 = FilePath::normalize(&local_408);
      pcVar4 = FilePath::getPath(pFVar3);
      local_8c3 = std::operator==(&local_360,pcVar4);
    }
    if ((local_409 & 1) != 0) {
      FilePath::~FilePath(&local_408);
    }
    if ((local_3e7 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_360);
    }
    if ((local_3e6 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_380);
    }
    if ((local_3e5 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_3a0);
    }
    if ((local_3e4 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_3c0);
    }
    if ((local_3e3 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_3e0);
    }
    if ((local_3e2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_3e1);
    }
    if (local_8c3 == false) {
      deAssertFail("(string(\"c:\") + FilePath::separator + \"foo\" + FilePath::separator + \"foo.txt\") == FilePath(\"c:/foo\\\\bar/..\\\\dir\\\\..\\\\foo.txt\").normalize().getPath()"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                   ,0xe6);
    }
    dVar2 = deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = deGetFalse();
    local_491 = 0;
    local_492 = 0;
    local_493 = 0;
    local_494 = 0;
    local_4b9 = 0;
    local_8e3 = false;
    if (dVar2 == 0) {
      std::operator+(&local_490,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     FilePath::separator_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     FilePath::separator_abi_cxx11_);
      local_491 = 1;
      std::operator+(&local_470,&local_490,"foo");
      local_492 = 1;
      std::operator+(&local_450,&local_470,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     FilePath::separator_abi_cxx11_);
      local_493 = 1;
      std::operator+(&local_430,&local_450,"foo.txt");
      local_494 = 1;
      FilePath::FilePath(&local_4b8,"\\\\foo\\bar/..\\dir\\..\\foo.txt");
      local_4b9 = 1;
      pFVar3 = FilePath::normalize(&local_4b8);
      pcVar4 = FilePath::getPath(pFVar3);
      local_8e3 = std::operator==(&local_430,pcVar4);
    }
    if ((local_4b9 & 1) != 0) {
      FilePath::~FilePath(&local_4b8);
    }
    if ((local_494 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_430);
    }
    if ((local_493 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_450);
    }
    if ((local_492 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_470);
    }
    if ((local_491 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_490);
    }
    if (local_8e3 == false) {
      deAssertFail("(FilePath::separator + FilePath::separator + \"foo\" + FilePath::separator + \"foo.txt\") == FilePath(\"\\\\\\\\foo\\\\bar/..\\\\dir\\\\..\\\\foo.txt\").normalize().getPath()"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                   ,0xe7);
    }
    dVar2 = deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = deGetFalse();
    local_501 = 0;
    local_502 = 0;
    local_903 = false;
    if (dVar2 == 0) {
      FilePath::FilePath(&local_500,"foo/bar");
      local_501 = 1;
      FilePath::getBaseName_abi_cxx11_(&local_4e0,&local_500);
      local_502 = 1;
      local_903 = std::operator==(&local_4e0,"bar");
    }
    if ((local_502 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_4e0);
    }
    if ((local_501 & 1) != 0) {
      FilePath::~FilePath(&local_500);
    }
    if (local_903 == false) {
      deAssertFail("FilePath(\"foo/bar\" ).getBaseName() == \"bar\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                   ,0xe9);
    }
    dVar2 = deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = deGetFalse();
    local_549 = 0;
    local_54a = 0;
    local_913 = false;
    if (dVar2 == 0) {
      FilePath::FilePath(&local_548,"foo/bar/");
      local_549 = 1;
      FilePath::getBaseName_abi_cxx11_(&local_528,&local_548);
      local_54a = 1;
      local_913 = std::operator==(&local_528,"bar");
    }
    if ((local_54a & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_528);
    }
    if ((local_549 & 1) != 0) {
      FilePath::~FilePath(&local_548);
    }
    if (local_913 == false) {
      deAssertFail("FilePath(\"foo/bar/\" ).getBaseName() == \"bar\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                   ,0xea);
    }
    dVar2 = deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = deGetFalse();
    local_591 = 0;
    local_592 = 0;
    local_923 = false;
    if (dVar2 == 0) {
      FilePath::FilePath(&local_590,"foo\\bar");
      local_591 = 1;
      FilePath::getBaseName_abi_cxx11_(&local_570,&local_590);
      local_592 = 1;
      local_923 = std::operator==(&local_570,"bar");
    }
    if ((local_592 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_570);
    }
    if ((local_591 & 1) != 0) {
      FilePath::~FilePath(&local_590);
    }
    if (local_923 == false) {
      deAssertFail("FilePath(\"foo\\\\bar\" ).getBaseName() == \"bar\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                   ,0xeb);
    }
    dVar2 = deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = deGetFalse();
    local_5d9 = 0;
    local_5da = 0;
    local_933 = false;
    if (dVar2 == 0) {
      FilePath::FilePath(&local_5d8,"foo\\bar\\");
      local_5d9 = 1;
      FilePath::getBaseName_abi_cxx11_(&local_5b8,&local_5d8);
      local_5da = 1;
      local_933 = std::operator==(&local_5b8,"bar");
    }
    if ((local_5da & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_5b8);
    }
    if ((local_5d9 & 1) != 0) {
      FilePath::~FilePath(&local_5d8);
    }
    if (local_933 == false) {
      deAssertFail("FilePath(\"foo\\\\bar\\\\\" ).getBaseName() == \"bar\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                   ,0xec);
    }
    dVar2 = deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = deGetFalse();
    local_621 = 0;
    local_622 = 0;
    local_943 = false;
    if (dVar2 == 0) {
      FilePath::FilePath(&local_620,"foo/bar");
      local_621 = 1;
      FilePath::getDirName_abi_cxx11_(&local_600,&local_620);
      local_622 = 1;
      local_943 = std::operator==(&local_600,"foo");
    }
    if ((local_622 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_600);
    }
    if ((local_621 & 1) != 0) {
      FilePath::~FilePath(&local_620);
    }
    if (local_943 == false) {
      deAssertFail("FilePath(\"foo/bar\" ).getDirName() == \"foo\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                   ,0xed);
    }
    dVar2 = deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = deGetFalse();
    local_669 = 0;
    local_66a = 0;
    local_953 = false;
    if (dVar2 == 0) {
      FilePath::FilePath(&local_668,"foo/bar/");
      local_669 = 1;
      FilePath::getDirName_abi_cxx11_(&local_648,&local_668);
      local_66a = 1;
      local_953 = std::operator==(&local_648,"foo");
    }
    if ((local_66a & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_648);
    }
    if ((local_669 & 1) != 0) {
      FilePath::~FilePath(&local_668);
    }
    if (local_953 == false) {
      deAssertFail("FilePath(\"foo/bar/\" ).getDirName() == \"foo\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                   ,0xee);
    }
    dVar2 = deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = deGetFalse();
    local_6b1 = 0;
    local_6b2 = 0;
    local_963 = false;
    if (dVar2 == 0) {
      FilePath::FilePath(&local_6b0,"foo\\bar");
      local_6b1 = 1;
      FilePath::getDirName_abi_cxx11_(&local_690,&local_6b0);
      local_6b2 = 1;
      local_963 = std::operator==(&local_690,"foo");
    }
    if ((local_6b2 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_690);
    }
    if ((local_6b1 & 1) != 0) {
      FilePath::~FilePath(&local_6b0);
    }
    if (local_963 == false) {
      deAssertFail("FilePath(\"foo\\\\bar\" ).getDirName() == \"foo\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                   ,0xef);
    }
    dVar2 = deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = deGetFalse();
    local_6f9 = 0;
    local_6fa = 0;
    local_973 = false;
    if (dVar2 == 0) {
      FilePath::FilePath(&local_6f8,"foo\\bar\\");
      local_6f9 = 1;
      FilePath::getDirName_abi_cxx11_(&local_6d8,&local_6f8);
      local_6fa = 1;
      local_973 = std::operator==(&local_6d8,"foo");
    }
    if ((local_6fa & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_6d8);
    }
    if ((local_6f9 & 1) != 0) {
      FilePath::~FilePath(&local_6f8);
    }
    if (local_973 == false) {
      deAssertFail("FilePath(\"foo\\\\bar\\\\\" ).getDirName() == \"foo\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                   ,0xf0);
    }
    dVar2 = deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = deGetFalse();
    local_741 = 0;
    local_742 = 0;
    local_983 = false;
    if (dVar2 == 0) {
      FilePath::FilePath(&local_740,"/foo/bar/baz");
      local_741 = 1;
      FilePath::getDirName_abi_cxx11_(&local_720,&local_740);
      local_742 = 1;
      std::operator+(&local_7a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     FilePath::separator_abi_cxx11_,"foo");
      std::operator+(&local_788,&local_7a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     FilePath::separator_abi_cxx11_);
      std::operator+(&local_768,&local_788,"bar");
      local_983 = std::operator==(&local_720,&local_768);
    }
    if (dVar2 == 0) {
      std::__cxx11::string::~string((string *)&local_768);
      std::__cxx11::string::~string((string *)&local_788);
      std::__cxx11::string::~string((string *)&local_7a8);
    }
    if ((local_742 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_720);
    }
    if ((local_741 & 1) != 0) {
      FilePath::~FilePath(&local_740);
    }
    if (local_983 == false) {
      deAssertFail("FilePath(\"/foo/bar/baz\" ).getDirName() == FilePath::separator + \"foo\" + FilePath::separator + \"bar\""
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                   ,0xf1);
    }
    dVar2 = deGetFalse();
  } while (dVar2 != 0);
  return;
}

Assistant:

void FilePath_selfTest (void)
{
	DE_TEST_ASSERT(!FilePath(".").isAbsolutePath());
	DE_TEST_ASSERT(!FilePath("..\\foo").isAbsolutePath());
	DE_TEST_ASSERT(!FilePath("foo").isAbsolutePath());
	DE_TEST_ASSERT(FilePath("\\foo/bar").isAbsolutePath());
	DE_TEST_ASSERT(FilePath("/foo").isAbsolutePath());
	DE_TEST_ASSERT(FilePath("\\").isAbsolutePath());
	DE_TEST_ASSERT(FilePath("\\\\net\\loc").isAbsolutePath());
	DE_TEST_ASSERT(FilePath("C:\\file.txt").isAbsolutePath());
	DE_TEST_ASSERT(FilePath("c:/file.txt").isAbsolutePath());

	DE_TEST_ASSERT(string(".") == FilePath(".//.").normalize().getPath());
	DE_TEST_ASSERT(string(".") == FilePath(".").normalize().getPath());
	DE_TEST_ASSERT((string("..") + FilePath::separator + "test") == FilePath("foo/../bar/../../test").normalize().getPath());
	DE_TEST_ASSERT((FilePath::separator + "foo" + FilePath::separator + "foo.txt") == FilePath("/foo\\bar/..\\dir\\..\\foo.txt").normalize().getPath());
	DE_TEST_ASSERT((string("c:") + FilePath::separator + "foo" + FilePath::separator + "foo.txt") == FilePath("c:/foo\\bar/..\\dir\\..\\foo.txt").normalize().getPath());
	DE_TEST_ASSERT((FilePath::separator + FilePath::separator + "foo" + FilePath::separator + "foo.txt") == FilePath("\\\\foo\\bar/..\\dir\\..\\foo.txt").normalize().getPath());

	DE_TEST_ASSERT(FilePath("foo/bar"		).getBaseName()	== "bar");
	DE_TEST_ASSERT(FilePath("foo/bar/"		).getBaseName()	== "bar");
	DE_TEST_ASSERT(FilePath("foo\\bar"		).getBaseName()	== "bar");
	DE_TEST_ASSERT(FilePath("foo\\bar\\"	).getBaseName()	== "bar");
	DE_TEST_ASSERT(FilePath("foo/bar"		).getDirName()	== "foo");
	DE_TEST_ASSERT(FilePath("foo/bar/"		).getDirName()	== "foo");
	DE_TEST_ASSERT(FilePath("foo\\bar"		).getDirName()	== "foo");
	DE_TEST_ASSERT(FilePath("foo\\bar\\"	).getDirName()	== "foo");
	DE_TEST_ASSERT(FilePath("/foo/bar/baz"	).getDirName()	== FilePath::separator + "foo" + FilePath::separator + "bar");
}